

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _tree.hpp
# Opt level: O0

void __thiscall
ft::RBTree<char,_ft::allocator<ft::treeNode<char>_>_>::treeTerminate
          (RBTree<char,_ft::allocator<ft::treeNode<char>_>_> *this)

{
  RBTree<char,_ft::allocator<ft::treeNode<char>_>_> *this_local;
  
  allocator<ft::treeNode<char>_>::destroy
            ((allocator<ft::treeNode<char>_> *)&this->field_0x20,this->NIL);
  allocator<ft::treeNode<char>_>::destroy
            ((allocator<ft::treeNode<char>_> *)&this->field_0x20,this->m_first);
  allocator<ft::treeNode<char>_>::destroy
            ((allocator<ft::treeNode<char>_> *)&this->field_0x20,this->m_last);
  allocator<ft::treeNode<char>_>::deallocate
            ((allocator<ft::treeNode<char>_> *)&this->field_0x20,this->NIL,1);
  allocator<ft::treeNode<char>_>::deallocate
            ((allocator<ft::treeNode<char>_> *)&this->field_0x20,this->m_first,1);
  allocator<ft::treeNode<char>_>::deallocate
            ((allocator<ft::treeNode<char>_> *)&this->field_0x20,this->m_last,1);
  return;
}

Assistant:

void treeTerminate() {
		this->m_alloc.destroy(this->NIL);
		this->m_alloc.destroy(this->m_first);
		this->m_alloc.destroy(this->m_last);
		this->m_alloc.deallocate(this->NIL, 1);
		this->m_alloc.deallocate(this->m_first, 1);
		this->m_alloc.deallocate(this->m_last, 1);
	}